

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  BYTE *pBVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  BYTE *pBVar5;
  ulong *iEnd;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  BYTE *pBVar10;
  ZSTD_matchState_t *pZVar11;
  ulong *mEnd;
  BYTE *pBVar12;
  U32 *pUVar13;
  U32 *pUVar14;
  undefined8 uVar15;
  U32 UVar16;
  uint uVar17;
  size_t sVar18;
  ulong *puVar19;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  ulong *puVar23;
  ulong uVar24;
  BYTE *pBVar25;
  U32 UVar26;
  ulong *puVar27;
  BYTE *litEnd;
  int iVar28;
  BYTE *iStart;
  int *piVar29;
  uint uVar30;
  ulong uVar31;
  long lVar32;
  ulong *puVar33;
  ulong *puVar34;
  ulong uVar35;
  long lVar36;
  U32 UVar37;
  ulong uVar38;
  seqDef *psVar39;
  U32 UVar40;
  BYTE *pBVar41;
  U32 UVar42;
  U32 prefixStartIndex;
  BYTE *litLimit_w_2;
  U32 dictIndexDelta;
  BYTE *litLimit_w;
  BYTE *iend;
  BYTE *base;
  BYTE *ilimit;
  BYTE *prefixStart;
  BYTE *dictBase;
  BYTE *dictEnd;
  U32 *hashTable;
  BYTE *dictStart;
  U32 *dictHashTable;
  U32 dictStartIndex;
  
  pBVar10 = (ms->window).base;
  uVar6 = (ms->window).dictLimit;
  iStart = pBVar10 + uVar6;
  pZVar11 = ms->dictMatchState;
  uVar7 = (pZVar11->window).dictLimit;
  mEnd = (ulong *)(pZVar11->window).nextSrc;
  pBVar12 = (pZVar11->window).base;
  pBVar41 = pBVar12 + uVar7;
  uVar21 = ((int)pBVar12 - (int)mEnd) + uVar6;
  iEnd = (ulong *)((long)src + srcSize);
  puVar4 = (ulong *)((long)src + (srcSize - 8));
  puVar27 = (ulong *)((ulong)(((int)src - (int)iStart) + (int)mEnd == (int)pBVar41) + (long)src);
  uVar8 = (ms->cParams).minMatch;
  pUVar13 = ms->hashTable;
  UVar42 = *rep;
  UVar40 = rep[1];
  pUVar14 = pZVar11->hashTable;
  iVar28 = (int)pBVar10;
  if (uVar8 == 5) {
    if (puVar27 < puVar4) {
      uVar8 = (ms->cParams).targetLength;
      bVar20 = 0x40 - (char)(ms->cParams).hashLog;
      uVar9 = (pZVar11->cParams).hashLog;
      puVar1 = iEnd + -4;
      do {
        uVar24 = *puVar27;
        uVar31 = uVar24 * -0x30e4432345000000 >> (bVar20 & 0x3f);
        uVar38 = (long)puVar27 - (long)pBVar10;
        UVar37 = (U32)uVar38;
        uVar22 = (UVar37 - UVar42) + 1;
        piVar29 = (int *)(pBVar10 + uVar22);
        if (uVar22 < uVar6) {
          piVar29 = (int *)(pBVar12 + (uVar22 - uVar21));
        }
        uVar17 = pUVar13[uVar31];
        uVar35 = (ulong)uVar17;
        pUVar13[uVar31] = UVar37;
        if (((uVar6 - 1) - uVar22 < 3) || (*piVar29 != *(int *)((long)puVar27 + 1))) {
          puVar23 = puVar27;
          if (uVar17 <= uVar6) {
            uVar22 = pUVar14[uVar24 * -0x30e4432345000000 >> (0x40U - (char)uVar9 & 0x3f)];
            if ((uVar22 <= uVar7) || (*(int *)(pBVar12 + uVar22) != (int)*puVar27))
            goto LAB_006a257a;
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar12 + uVar22) + 4),
                                (BYTE *)iEnd,(BYTE *)mEnd,iStart);
            lVar32 = sVar18 + 4;
            if (src < puVar27) {
              pBVar25 = pBVar12 + ((ulong)uVar22 - 1);
              do {
                puVar34 = (ulong *)((long)puVar27 + -1);
                puVar23 = puVar27;
                if ((*(BYTE *)puVar34 != *pBVar25) ||
                   (lVar32 = lVar32 + 1, puVar23 = puVar34, pBVar25 <= pBVar41)) break;
                pBVar25 = pBVar25 + -1;
                puVar27 = puVar34;
              } while (src < puVar34);
            }
            uVar24 = (long)puVar23 - (long)src;
            puVar27 = (ulong *)seqStore->lit;
            if (puVar1 < puVar23) {
              puVar34 = puVar27;
              puVar33 = (ulong *)src;
              if (src <= puVar1) {
                puVar34 = (ulong *)((long)puVar27 + ((long)puVar1 - (long)src));
                uVar31 = *(ulong *)((long)src + 8);
                *puVar27 = *src;
                puVar27[1] = uVar31;
                puVar33 = puVar1;
                if (0x10 < (long)puVar1 - (long)src) {
                  lVar36 = 0x10;
                  do {
                    uVar15 = *(undefined8 *)((BYTE *)((long)src + lVar36) + 8);
                    puVar3 = (undefined8 *)((long)puVar27 + lVar36);
                    *puVar3 = *(undefined8 *)((long)src + lVar36);
                    puVar3[1] = uVar15;
                    pBVar25 = (BYTE *)((long)src + lVar36 + 0x10);
                    uVar15 = *(undefined8 *)(pBVar25 + 8);
                    puVar3[2] = *(undefined8 *)pBVar25;
                    puVar3[3] = uVar15;
                    lVar36 = lVar36 + 0x20;
                  } while (puVar3 + 4 < puVar34);
                }
              }
              if (puVar33 < puVar23) {
                lVar36 = 0;
                do {
                  *(BYTE *)((long)puVar34 + lVar36) = *(BYTE *)((long)puVar33 + lVar36);
                  lVar36 = lVar36 + 1;
                } while ((long)puVar23 - (long)puVar33 != lVar36);
              }
LAB_006a2925:
              seqStore->lit = seqStore->lit + uVar24;
              psVar39 = seqStore->sequences;
              if (0xffff < uVar24) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
              }
            }
            else {
              uVar31 = *(ulong *)((long)src + 8);
              *puVar27 = *src;
              puVar27[1] = uVar31;
              pBVar25 = seqStore->lit;
              if (0x10 < uVar24) {
                uVar31 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar25 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar25 + 0x18) = uVar31;
                if (0x20 < (long)uVar24) {
                  lVar36 = 0;
                  do {
                    pBVar5 = (BYTE *)((long)src + lVar36 + 0x20);
                    uVar15 = *(undefined8 *)(pBVar5 + 8);
                    pBVar2 = pBVar25 + lVar36 + 0x20;
                    *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                    *(undefined8 *)(pBVar2 + 8) = uVar15;
                    pBVar5 = (BYTE *)((long)src + lVar36 + 0x30);
                    uVar15 = *(undefined8 *)(pBVar5 + 8);
                    *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                    *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                    lVar36 = lVar36 + 0x20;
                  } while (pBVar2 + 0x20 < pBVar25 + uVar24);
                }
                goto LAB_006a2925;
              }
              seqStore->lit = pBVar25 + uVar24;
              psVar39 = seqStore->sequences;
            }
            UVar26 = UVar37 - (uVar22 + uVar21);
            uVar31 = lVar32 - 3;
            psVar39->litLength = (U16)uVar24;
            psVar39->offset = UVar26 + 3;
            UVar40 = UVar42;
            goto joined_r0x006a29f9;
          }
          piVar29 = (int *)(pBVar10 + uVar35);
          if (*piVar29 == (int)*puVar27) {
            puVar34 = (ulong *)((long)puVar27 + 4);
            puVar33 = (ulong *)(piVar29 + 1);
            puVar19 = puVar34;
            if (puVar34 < (ulong *)((long)iEnd - 7U)) {
              if (*puVar33 == *puVar34) {
                lVar32 = 0;
                do {
                  puVar33 = (ulong *)((long)puVar27 + lVar32 + 0xc);
                  if ((ulong *)((long)iEnd - 7U) <= puVar33) {
                    puVar33 = (ulong *)(pBVar10 + lVar32 + uVar35 + 0xc);
                    puVar19 = (ulong *)((long)puVar27 + lVar32 + 0xc);
                    goto LAB_006a26f0;
                  }
                  lVar36 = lVar32 + uVar35 + 0xc;
                  uVar24 = *puVar33;
                  lVar32 = lVar32 + 8;
                } while (*(ulong *)(pBVar10 + lVar36) == uVar24);
                uVar24 = uVar24 ^ *(ulong *)(pBVar10 + lVar36);
                uVar31 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                uVar24 = (uVar31 >> 3 & 0x1fffffff) + lVar32;
              }
              else {
                uVar31 = *puVar34 ^ *puVar33;
                uVar24 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                  }
                }
                uVar24 = uVar24 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_006a26f0:
              if ((puVar19 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar33 == (int)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar19 < (ulong *)((long)iEnd + -1)) && ((short)*puVar33 == (short)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar19 < iEnd) {
                puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar19));
              }
              uVar24 = (long)puVar19 - (long)puVar34;
            }
            lVar32 = uVar24 + 4;
            if (src < puVar27) {
              pBVar25 = pBVar10 + (uVar35 - 1);
              do {
                puVar34 = (ulong *)((long)puVar23 + -1);
                if ((*(BYTE *)puVar34 != *pBVar25) ||
                   (lVar32 = lVar32 + 1, puVar23 = puVar34, pBVar25 <= iStart)) break;
                pBVar25 = pBVar25 + -1;
              } while (src < puVar34);
            }
            uVar24 = (long)puVar23 - (long)src;
            puVar34 = (ulong *)seqStore->lit;
            if (puVar1 < puVar23) {
              puVar19 = (ulong *)src;
              puVar33 = puVar34;
              if (src <= puVar1) {
                puVar33 = (ulong *)((long)puVar34 + ((long)puVar1 - (long)src));
                uVar31 = *(ulong *)((long)src + 8);
                *puVar34 = *src;
                puVar34[1] = uVar31;
                puVar19 = puVar1;
                if (0x10 < (long)puVar1 - (long)src) {
                  lVar36 = 0x10;
                  do {
                    uVar15 = *(undefined8 *)((BYTE *)((long)src + lVar36) + 8);
                    puVar3 = (undefined8 *)((long)puVar34 + lVar36);
                    *puVar3 = *(undefined8 *)((long)src + lVar36);
                    puVar3[1] = uVar15;
                    pBVar25 = (BYTE *)((long)src + lVar36 + 0x10);
                    uVar15 = *(undefined8 *)(pBVar25 + 8);
                    puVar3[2] = *(undefined8 *)pBVar25;
                    puVar3[3] = uVar15;
                    lVar36 = lVar36 + 0x20;
                  } while (puVar3 + 4 < puVar33);
                }
              }
              if (puVar19 < puVar23) {
                lVar36 = 0;
                do {
                  *(BYTE *)((long)puVar33 + lVar36) = *(BYTE *)((long)puVar19 + lVar36);
                  lVar36 = lVar36 + 1;
                } while ((long)puVar23 - (long)puVar19 != lVar36);
              }
LAB_006a29ae:
              seqStore->lit = seqStore->lit + uVar24;
              psVar39 = seqStore->sequences;
              if (0xffff < uVar24) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
              }
            }
            else {
              uVar31 = *(ulong *)((long)src + 8);
              *puVar34 = *src;
              puVar34[1] = uVar31;
              pBVar25 = seqStore->lit;
              if (0x10 < uVar24) {
                uVar31 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar25 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar25 + 0x18) = uVar31;
                if (0x20 < (long)uVar24) {
                  lVar36 = 0;
                  do {
                    pBVar5 = (BYTE *)((long)src + lVar36 + 0x20);
                    uVar15 = *(undefined8 *)(pBVar5 + 8);
                    pBVar2 = pBVar25 + lVar36 + 0x20;
                    *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                    *(undefined8 *)(pBVar2 + 8) = uVar15;
                    pBVar5 = (BYTE *)((long)src + lVar36 + 0x30);
                    uVar15 = *(undefined8 *)(pBVar5 + 8);
                    *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                    *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                    lVar36 = lVar36 + 0x20;
                  } while (pBVar2 + 0x20 < pBVar25 + uVar24);
                }
                goto LAB_006a29ae;
              }
              seqStore->lit = pBVar25 + uVar24;
              psVar39 = seqStore->sequences;
            }
            UVar26 = (int)puVar27 - (int)piVar29;
            uVar31 = lVar32 - 3;
            psVar39->litLength = (U16)uVar24;
            psVar39->offset = UVar26 + 3;
            UVar40 = UVar42;
            goto joined_r0x006a29f9;
          }
LAB_006a257a:
          puVar27 = (ulong *)((long)puVar27 +
                             ((long)puVar27 - (long)src >> 8) + (ulong)(uVar8 + (uVar8 == 0)));
        }
        else {
          puVar23 = (ulong *)((long)puVar27 + 1);
          puVar34 = iEnd;
          if (uVar22 < uVar6) {
            puVar34 = mEnd;
          }
          sVar18 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar27 + 5),(BYTE *)(piVar29 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar34,iStart);
          uVar24 = (long)puVar23 - (long)src;
          puVar27 = (ulong *)seqStore->lit;
          if (puVar1 < puVar23) {
            puVar34 = puVar27;
            puVar33 = (ulong *)src;
            if (src <= puVar1) {
              puVar34 = (ulong *)((long)puVar27 + ((long)puVar1 - (long)src));
              uVar31 = *(ulong *)((long)src + 8);
              *puVar27 = *src;
              puVar27[1] = uVar31;
              puVar33 = puVar1;
              if (0x10 < (long)puVar1 - (long)src) {
                lVar32 = 0x10;
                do {
                  uVar15 = *(undefined8 *)((BYTE *)((long)src + lVar32) + 8);
                  puVar3 = (undefined8 *)((long)puVar27 + lVar32);
                  *puVar3 = *(undefined8 *)((long)src + lVar32);
                  puVar3[1] = uVar15;
                  pBVar25 = (BYTE *)((long)src + lVar32 + 0x10);
                  uVar15 = *(undefined8 *)(pBVar25 + 8);
                  puVar3[2] = *(undefined8 *)pBVar25;
                  puVar3[3] = uVar15;
                  lVar32 = lVar32 + 0x20;
                } while (puVar3 + 4 < puVar34);
              }
            }
            if (puVar33 < puVar23) {
              lVar32 = 0;
              do {
                *(BYTE *)((long)puVar34 + lVar32) = *(BYTE *)((long)puVar33 + lVar32);
                lVar32 = lVar32 + 1;
              } while ((long)puVar23 - (long)puVar33 != lVar32);
            }
LAB_006a2666:
            seqStore->lit = seqStore->lit + uVar24;
            psVar39 = seqStore->sequences;
            if (0xffff < uVar24) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar31 = *(ulong *)((long)src + 8);
            *puVar27 = *src;
            puVar27[1] = uVar31;
            pBVar25 = seqStore->lit;
            if (0x10 < uVar24) {
              uVar31 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar25 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar25 + 0x18) = uVar31;
              if (0x20 < (long)uVar24) {
                lVar32 = 0;
                do {
                  pBVar5 = (BYTE *)((long)src + lVar32 + 0x20);
                  uVar15 = *(undefined8 *)(pBVar5 + 8);
                  pBVar2 = pBVar25 + lVar32 + 0x20;
                  *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                  *(undefined8 *)(pBVar2 + 8) = uVar15;
                  pBVar5 = (BYTE *)((long)src + lVar32 + 0x30);
                  uVar15 = *(undefined8 *)(pBVar5 + 8);
                  *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                  *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                  lVar32 = lVar32 + 0x20;
                } while (pBVar2 + 0x20 < pBVar25 + uVar24);
              }
              goto LAB_006a2666;
            }
            seqStore->lit = pBVar25 + uVar24;
            psVar39 = seqStore->sequences;
          }
          lVar32 = sVar18 + 4;
          uVar31 = sVar18 + 1;
          psVar39->litLength = (U16)uVar24;
          psVar39->offset = 1;
          UVar26 = UVar42;
joined_r0x006a29f9:
          if (0xffff < uVar31) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
          }
          puVar27 = (ulong *)(lVar32 + (long)puVar23);
          psVar39->matchLength = (U16)uVar31;
          psVar39 = psVar39 + 1;
          seqStore->sequences = psVar39;
          src = puVar27;
          UVar42 = UVar26;
          if (puVar27 <= puVar4) {
            pUVar13[(ulong)(*(long *)(pBVar10 + (uVar38 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                    (bVar20 & 0x3f)] = UVar37 + 2;
            pUVar13[(ulong)(*(long *)((long)puVar27 + -2) * -0x30e4432345000000) >> (bVar20 & 0x3f)]
                 = ((int)puVar27 + -2) - iVar28;
            UVar37 = UVar40;
            do {
              UVar16 = UVar26;
              UVar26 = (int)puVar27 - iVar28;
              uVar22 = UVar26 - UVar37;
              pBVar25 = pBVar10;
              if (uVar22 < uVar6) {
                pBVar25 = pBVar12 + -(ulong)uVar21;
              }
              src = puVar27;
              UVar42 = UVar16;
              UVar40 = UVar37;
              if (((uVar6 - 1) - uVar22 < 3) || (*(int *)(pBVar25 + uVar22) != (int)*puVar27))
              break;
              puVar23 = iEnd;
              if (uVar22 < uVar6) {
                puVar23 = mEnd;
              }
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar25 + uVar22) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar23,iStart);
              if (puVar27 <= puVar1) {
                puVar23 = (ulong *)seqStore->lit;
                uVar24 = puVar27[1];
                *puVar23 = *puVar27;
                puVar23[1] = uVar24;
                psVar39 = seqStore->sequences;
              }
              psVar39->litLength = 0;
              psVar39->offset = 1;
              if (0xffff < sVar18 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar39->matchLength = (U16)(sVar18 + 1);
              psVar39 = psVar39 + 1;
              seqStore->sequences = psVar39;
              pUVar13[*puVar27 * -0x30e4432345000000 >> (bVar20 & 0x3f)] = UVar26;
              puVar27 = (ulong *)((long)puVar27 + sVar18 + 4);
              src = puVar27;
              UVar42 = UVar37;
              UVar40 = UVar16;
              UVar26 = UVar37;
              UVar37 = UVar16;
            } while (puVar27 <= puVar4);
          }
        }
      } while (puVar27 < puVar4);
    }
  }
  else if (uVar8 == 6) {
    if (puVar27 < puVar4) {
      uVar8 = (ms->cParams).targetLength;
      bVar20 = 0x40 - (char)(ms->cParams).hashLog;
      uVar9 = (pZVar11->cParams).hashLog;
      puVar1 = iEnd + -4;
      do {
        uVar24 = *puVar27;
        uVar31 = uVar24 * -0x30e4432340650000 >> (bVar20 & 0x3f);
        uVar38 = (long)puVar27 - (long)pBVar10;
        UVar37 = (U32)uVar38;
        uVar22 = (UVar37 - UVar42) + 1;
        piVar29 = (int *)(pBVar10 + uVar22);
        if (uVar22 < uVar6) {
          piVar29 = (int *)(pBVar12 + (uVar22 - uVar21));
        }
        uVar17 = pUVar13[uVar31];
        uVar35 = (ulong)uVar17;
        pUVar13[uVar31] = UVar37;
        if (((uVar6 - 1) - uVar22 < 3) || (*piVar29 != *(int *)((long)puVar27 + 1))) {
          puVar23 = puVar27;
          if (uVar17 <= uVar6) {
            uVar22 = pUVar14[uVar24 * -0x30e4432340650000 >> (0x40U - (char)uVar9 & 0x3f)];
            if ((uVar22 <= uVar7) || (*(int *)(pBVar12 + uVar22) != (int)*puVar27))
            goto LAB_006a1c76;
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar12 + uVar22) + 4),
                                (BYTE *)iEnd,(BYTE *)mEnd,iStart);
            lVar32 = sVar18 + 4;
            if (src < puVar27) {
              pBVar25 = pBVar12 + ((ulong)uVar22 - 1);
              do {
                puVar34 = (ulong *)((long)puVar27 + -1);
                puVar23 = puVar27;
                if ((*(BYTE *)puVar34 != *pBVar25) ||
                   (lVar32 = lVar32 + 1, puVar23 = puVar34, pBVar25 <= pBVar41)) break;
                pBVar25 = pBVar25 + -1;
                puVar27 = puVar34;
              } while (src < puVar34);
            }
            uVar24 = (long)puVar23 - (long)src;
            puVar27 = (ulong *)seqStore->lit;
            if (puVar1 < puVar23) {
              puVar34 = puVar27;
              puVar33 = (ulong *)src;
              if (src <= puVar1) {
                puVar34 = (ulong *)((long)puVar27 + ((long)puVar1 - (long)src));
                uVar31 = *(ulong *)((long)src + 8);
                *puVar27 = *src;
                puVar27[1] = uVar31;
                puVar33 = puVar1;
                if (0x10 < (long)puVar1 - (long)src) {
                  lVar36 = 0x10;
                  do {
                    uVar15 = *(undefined8 *)((BYTE *)((long)src + lVar36) + 8);
                    puVar3 = (undefined8 *)((long)puVar27 + lVar36);
                    *puVar3 = *(undefined8 *)((long)src + lVar36);
                    puVar3[1] = uVar15;
                    pBVar25 = (BYTE *)((long)src + lVar36 + 0x10);
                    uVar15 = *(undefined8 *)(pBVar25 + 8);
                    puVar3[2] = *(undefined8 *)pBVar25;
                    puVar3[3] = uVar15;
                    lVar36 = lVar36 + 0x20;
                  } while (puVar3 + 4 < puVar34);
                }
              }
              if (puVar33 < puVar23) {
                lVar36 = 0;
                do {
                  *(BYTE *)((long)puVar34 + lVar36) = *(BYTE *)((long)puVar33 + lVar36);
                  lVar36 = lVar36 + 1;
                } while ((long)puVar23 - (long)puVar33 != lVar36);
              }
LAB_006a2024:
              seqStore->lit = seqStore->lit + uVar24;
              psVar39 = seqStore->sequences;
              if (0xffff < uVar24) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
              }
            }
            else {
              uVar31 = *(ulong *)((long)src + 8);
              *puVar27 = *src;
              puVar27[1] = uVar31;
              pBVar25 = seqStore->lit;
              if (0x10 < uVar24) {
                uVar31 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar25 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar25 + 0x18) = uVar31;
                if (0x20 < (long)uVar24) {
                  lVar36 = 0;
                  do {
                    pBVar5 = (BYTE *)((long)src + lVar36 + 0x20);
                    uVar15 = *(undefined8 *)(pBVar5 + 8);
                    pBVar2 = pBVar25 + lVar36 + 0x20;
                    *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                    *(undefined8 *)(pBVar2 + 8) = uVar15;
                    pBVar5 = (BYTE *)((long)src + lVar36 + 0x30);
                    uVar15 = *(undefined8 *)(pBVar5 + 8);
                    *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                    *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                    lVar36 = lVar36 + 0x20;
                  } while (pBVar2 + 0x20 < pBVar25 + uVar24);
                }
                goto LAB_006a2024;
              }
              seqStore->lit = pBVar25 + uVar24;
              psVar39 = seqStore->sequences;
            }
            UVar26 = UVar37 - (uVar22 + uVar21);
            uVar31 = lVar32 - 3;
            psVar39->litLength = (U16)uVar24;
            psVar39->offset = UVar26 + 3;
            UVar40 = UVar42;
            goto joined_r0x006a20f8;
          }
          piVar29 = (int *)(pBVar10 + uVar35);
          if (*piVar29 == (int)*puVar27) {
            puVar34 = (ulong *)((long)puVar27 + 4);
            puVar33 = (ulong *)(piVar29 + 1);
            puVar19 = puVar34;
            if (puVar34 < (ulong *)((long)iEnd - 7U)) {
              if (*puVar33 == *puVar34) {
                lVar32 = 0;
                do {
                  puVar33 = (ulong *)((long)puVar27 + lVar32 + 0xc);
                  if ((ulong *)((long)iEnd - 7U) <= puVar33) {
                    puVar33 = (ulong *)(pBVar10 + lVar32 + uVar35 + 0xc);
                    puVar19 = (ulong *)((long)puVar27 + lVar32 + 0xc);
                    goto LAB_006a1def;
                  }
                  lVar36 = lVar32 + uVar35 + 0xc;
                  uVar24 = *puVar33;
                  lVar32 = lVar32 + 8;
                } while (*(ulong *)(pBVar10 + lVar36) == uVar24);
                uVar24 = uVar24 ^ *(ulong *)(pBVar10 + lVar36);
                uVar31 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                uVar24 = (uVar31 >> 3 & 0x1fffffff) + lVar32;
              }
              else {
                uVar31 = *puVar34 ^ *puVar33;
                uVar24 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                  }
                }
                uVar24 = uVar24 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_006a1def:
              if ((puVar19 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar33 == (int)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar19 < (ulong *)((long)iEnd + -1)) && ((short)*puVar33 == (short)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar19 < iEnd) {
                puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar19));
              }
              uVar24 = (long)puVar19 - (long)puVar34;
            }
            lVar32 = uVar24 + 4;
            if (src < puVar27) {
              pBVar25 = pBVar10 + (uVar35 - 1);
              do {
                puVar34 = (ulong *)((long)puVar23 + -1);
                if ((*(BYTE *)puVar34 != *pBVar25) ||
                   (lVar32 = lVar32 + 1, puVar23 = puVar34, pBVar25 <= iStart)) break;
                pBVar25 = pBVar25 + -1;
              } while (src < puVar34);
            }
            uVar24 = (long)puVar23 - (long)src;
            puVar34 = (ulong *)seqStore->lit;
            if (puVar1 < puVar23) {
              puVar19 = (ulong *)src;
              puVar33 = puVar34;
              if (src <= puVar1) {
                puVar33 = (ulong *)((long)puVar34 + ((long)puVar1 - (long)src));
                uVar31 = *(ulong *)((long)src + 8);
                *puVar34 = *src;
                puVar34[1] = uVar31;
                puVar19 = puVar1;
                if (0x10 < (long)puVar1 - (long)src) {
                  lVar36 = 0x10;
                  do {
                    uVar15 = *(undefined8 *)((BYTE *)((long)src + lVar36) + 8);
                    puVar3 = (undefined8 *)((long)puVar34 + lVar36);
                    *puVar3 = *(undefined8 *)((long)src + lVar36);
                    puVar3[1] = uVar15;
                    pBVar25 = (BYTE *)((long)src + lVar36 + 0x10);
                    uVar15 = *(undefined8 *)(pBVar25 + 8);
                    puVar3[2] = *(undefined8 *)pBVar25;
                    puVar3[3] = uVar15;
                    lVar36 = lVar36 + 0x20;
                  } while (puVar3 + 4 < puVar33);
                }
              }
              if (puVar19 < puVar23) {
                lVar36 = 0;
                do {
                  *(BYTE *)((long)puVar33 + lVar36) = *(BYTE *)((long)puVar19 + lVar36);
                  lVar36 = lVar36 + 1;
                } while ((long)puVar23 - (long)puVar19 != lVar36);
              }
LAB_006a20ad:
              seqStore->lit = seqStore->lit + uVar24;
              psVar39 = seqStore->sequences;
              if (0xffff < uVar24) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
              }
            }
            else {
              uVar31 = *(ulong *)((long)src + 8);
              *puVar34 = *src;
              puVar34[1] = uVar31;
              pBVar25 = seqStore->lit;
              if (0x10 < uVar24) {
                uVar31 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar25 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar25 + 0x18) = uVar31;
                if (0x20 < (long)uVar24) {
                  lVar36 = 0;
                  do {
                    pBVar5 = (BYTE *)((long)src + lVar36 + 0x20);
                    uVar15 = *(undefined8 *)(pBVar5 + 8);
                    pBVar2 = pBVar25 + lVar36 + 0x20;
                    *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                    *(undefined8 *)(pBVar2 + 8) = uVar15;
                    pBVar5 = (BYTE *)((long)src + lVar36 + 0x30);
                    uVar15 = *(undefined8 *)(pBVar5 + 8);
                    *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                    *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                    lVar36 = lVar36 + 0x20;
                  } while (pBVar2 + 0x20 < pBVar25 + uVar24);
                }
                goto LAB_006a20ad;
              }
              seqStore->lit = pBVar25 + uVar24;
              psVar39 = seqStore->sequences;
            }
            UVar26 = (int)puVar27 - (int)piVar29;
            uVar31 = lVar32 - 3;
            psVar39->litLength = (U16)uVar24;
            psVar39->offset = UVar26 + 3;
            UVar40 = UVar42;
            goto joined_r0x006a20f8;
          }
LAB_006a1c76:
          puVar27 = (ulong *)((long)puVar27 +
                             ((long)puVar27 - (long)src >> 8) + (ulong)(uVar8 + (uVar8 == 0)));
        }
        else {
          puVar23 = (ulong *)((long)puVar27 + 1);
          puVar34 = iEnd;
          if (uVar22 < uVar6) {
            puVar34 = mEnd;
          }
          sVar18 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar27 + 5),(BYTE *)(piVar29 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar34,iStart);
          uVar24 = (long)puVar23 - (long)src;
          puVar27 = (ulong *)seqStore->lit;
          if (puVar1 < puVar23) {
            puVar34 = puVar27;
            puVar33 = (ulong *)src;
            if (src <= puVar1) {
              puVar34 = (ulong *)((long)puVar27 + ((long)puVar1 - (long)src));
              uVar31 = *(ulong *)((long)src + 8);
              *puVar27 = *src;
              puVar27[1] = uVar31;
              puVar33 = puVar1;
              if (0x10 < (long)puVar1 - (long)src) {
                lVar32 = 0x10;
                do {
                  uVar15 = *(undefined8 *)((BYTE *)((long)src + lVar32) + 8);
                  puVar3 = (undefined8 *)((long)puVar27 + lVar32);
                  *puVar3 = *(undefined8 *)((long)src + lVar32);
                  puVar3[1] = uVar15;
                  pBVar25 = (BYTE *)((long)src + lVar32 + 0x10);
                  uVar15 = *(undefined8 *)(pBVar25 + 8);
                  puVar3[2] = *(undefined8 *)pBVar25;
                  puVar3[3] = uVar15;
                  lVar32 = lVar32 + 0x20;
                } while (puVar3 + 4 < puVar34);
              }
            }
            if (puVar33 < puVar23) {
              lVar32 = 0;
              do {
                *(BYTE *)((long)puVar34 + lVar32) = *(BYTE *)((long)puVar33 + lVar32);
                lVar32 = lVar32 + 1;
              } while ((long)puVar23 - (long)puVar33 != lVar32);
            }
LAB_006a1d65:
            seqStore->lit = seqStore->lit + uVar24;
            psVar39 = seqStore->sequences;
            if (0xffff < uVar24) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar31 = *(ulong *)((long)src + 8);
            *puVar27 = *src;
            puVar27[1] = uVar31;
            pBVar25 = seqStore->lit;
            if (0x10 < uVar24) {
              uVar31 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar25 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar25 + 0x18) = uVar31;
              if (0x20 < (long)uVar24) {
                lVar32 = 0;
                do {
                  pBVar5 = (BYTE *)((long)src + lVar32 + 0x20);
                  uVar15 = *(undefined8 *)(pBVar5 + 8);
                  pBVar2 = pBVar25 + lVar32 + 0x20;
                  *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                  *(undefined8 *)(pBVar2 + 8) = uVar15;
                  pBVar5 = (BYTE *)((long)src + lVar32 + 0x30);
                  uVar15 = *(undefined8 *)(pBVar5 + 8);
                  *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                  *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                  lVar32 = lVar32 + 0x20;
                } while (pBVar2 + 0x20 < pBVar25 + uVar24);
              }
              goto LAB_006a1d65;
            }
            seqStore->lit = pBVar25 + uVar24;
            psVar39 = seqStore->sequences;
          }
          lVar32 = sVar18 + 4;
          uVar31 = sVar18 + 1;
          psVar39->litLength = (U16)uVar24;
          psVar39->offset = 1;
          UVar26 = UVar42;
joined_r0x006a20f8:
          if (0xffff < uVar31) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
          }
          puVar27 = (ulong *)(lVar32 + (long)puVar23);
          psVar39->matchLength = (U16)uVar31;
          psVar39 = psVar39 + 1;
          seqStore->sequences = psVar39;
          src = puVar27;
          UVar42 = UVar26;
          if (puVar27 <= puVar4) {
            pUVar13[(ulong)(*(long *)(pBVar10 + (uVar38 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                    (bVar20 & 0x3f)] = UVar37 + 2;
            pUVar13[(ulong)(*(long *)((long)puVar27 + -2) * -0x30e4432340650000) >> (bVar20 & 0x3f)]
                 = ((int)puVar27 + -2) - iVar28;
            UVar37 = UVar40;
            do {
              UVar16 = UVar26;
              UVar26 = (int)puVar27 - iVar28;
              uVar22 = UVar26 - UVar37;
              pBVar25 = pBVar10;
              if (uVar22 < uVar6) {
                pBVar25 = pBVar12 + -(ulong)uVar21;
              }
              src = puVar27;
              UVar42 = UVar16;
              UVar40 = UVar37;
              if (((uVar6 - 1) - uVar22 < 3) || (*(int *)(pBVar25 + uVar22) != (int)*puVar27))
              break;
              puVar23 = iEnd;
              if (uVar22 < uVar6) {
                puVar23 = mEnd;
              }
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar25 + uVar22) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar23,iStart);
              if (puVar27 <= puVar1) {
                puVar23 = (ulong *)seqStore->lit;
                uVar24 = puVar27[1];
                *puVar23 = *puVar27;
                puVar23[1] = uVar24;
                psVar39 = seqStore->sequences;
              }
              psVar39->litLength = 0;
              psVar39->offset = 1;
              if (0xffff < sVar18 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar39->matchLength = (U16)(sVar18 + 1);
              psVar39 = psVar39 + 1;
              seqStore->sequences = psVar39;
              pUVar13[*puVar27 * -0x30e4432340650000 >> (bVar20 & 0x3f)] = UVar26;
              puVar27 = (ulong *)((long)puVar27 + sVar18 + 4);
              src = puVar27;
              UVar42 = UVar37;
              UVar40 = UVar16;
              UVar26 = UVar37;
              UVar37 = UVar16;
            } while (puVar27 <= puVar4);
          }
        }
      } while (puVar27 < puVar4);
    }
  }
  else if (uVar8 == 7) {
    if (puVar27 < puVar4) {
      uVar8 = (ms->cParams).targetLength;
      bVar20 = 0x40 - (char)(ms->cParams).hashLog;
      uVar9 = (pZVar11->cParams).hashLog;
      puVar1 = iEnd + -4;
      do {
        uVar24 = *puVar27;
        uVar31 = uVar24 * -0x30e44323405a9d00 >> (bVar20 & 0x3f);
        uVar38 = (long)puVar27 - (long)pBVar10;
        UVar37 = (U32)uVar38;
        uVar22 = (UVar37 - UVar42) + 1;
        piVar29 = (int *)(pBVar10 + uVar22);
        if (uVar22 < uVar6) {
          piVar29 = (int *)(pBVar12 + (uVar22 - uVar21));
        }
        uVar17 = pUVar13[uVar31];
        uVar35 = (ulong)uVar17;
        pUVar13[uVar31] = UVar37;
        if (((uVar6 - 1) - uVar22 < 3) || (*piVar29 != *(int *)((long)puVar27 + 1))) {
          puVar23 = puVar27;
          if (uVar17 <= uVar6) {
            uVar22 = pUVar14[uVar24 * -0x30e44323405a9d00 >> (0x40U - (char)uVar9 & 0x3f)];
            if ((uVar22 <= uVar7) || (*(int *)(pBVar12 + uVar22) != (int)*puVar27))
            goto LAB_006a1361;
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar12 + uVar22) + 4),
                                (BYTE *)iEnd,(BYTE *)mEnd,iStart);
            lVar32 = sVar18 + 4;
            if (src < puVar27) {
              pBVar25 = pBVar12 + ((ulong)uVar22 - 1);
              do {
                puVar34 = (ulong *)((long)puVar27 + -1);
                puVar23 = puVar27;
                if ((*(BYTE *)puVar34 != *pBVar25) ||
                   (lVar32 = lVar32 + 1, puVar23 = puVar34, pBVar25 <= pBVar41)) break;
                pBVar25 = pBVar25 + -1;
                puVar27 = puVar34;
              } while (src < puVar34);
            }
            uVar24 = (long)puVar23 - (long)src;
            puVar27 = (ulong *)seqStore->lit;
            if (puVar1 < puVar23) {
              puVar34 = puVar27;
              puVar33 = (ulong *)src;
              if (src <= puVar1) {
                puVar34 = (ulong *)((long)puVar27 + ((long)puVar1 - (long)src));
                uVar31 = *(ulong *)((long)src + 8);
                *puVar27 = *src;
                puVar27[1] = uVar31;
                puVar33 = puVar1;
                if (0x10 < (long)puVar1 - (long)src) {
                  lVar36 = 0x10;
                  do {
                    uVar15 = *(undefined8 *)((BYTE *)((long)src + lVar36) + 8);
                    puVar3 = (undefined8 *)((long)puVar27 + lVar36);
                    *puVar3 = *(undefined8 *)((long)src + lVar36);
                    puVar3[1] = uVar15;
                    pBVar25 = (BYTE *)((long)src + lVar36 + 0x10);
                    uVar15 = *(undefined8 *)(pBVar25 + 8);
                    puVar3[2] = *(undefined8 *)pBVar25;
                    puVar3[3] = uVar15;
                    lVar36 = lVar36 + 0x20;
                  } while (puVar3 + 4 < puVar34);
                }
              }
              if (puVar33 < puVar23) {
                lVar36 = 0;
                do {
                  *(BYTE *)((long)puVar34 + lVar36) = *(BYTE *)((long)puVar33 + lVar36);
                  lVar36 = lVar36 + 1;
                } while ((long)puVar23 - (long)puVar33 != lVar36);
              }
LAB_006a170f:
              seqStore->lit = seqStore->lit + uVar24;
              psVar39 = seqStore->sequences;
              if (0xffff < uVar24) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
              }
            }
            else {
              uVar31 = *(ulong *)((long)src + 8);
              *puVar27 = *src;
              puVar27[1] = uVar31;
              pBVar25 = seqStore->lit;
              if (0x10 < uVar24) {
                uVar31 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar25 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar25 + 0x18) = uVar31;
                if (0x20 < (long)uVar24) {
                  lVar36 = 0;
                  do {
                    pBVar5 = (BYTE *)((long)src + lVar36 + 0x20);
                    uVar15 = *(undefined8 *)(pBVar5 + 8);
                    pBVar2 = pBVar25 + lVar36 + 0x20;
                    *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                    *(undefined8 *)(pBVar2 + 8) = uVar15;
                    pBVar5 = (BYTE *)((long)src + lVar36 + 0x30);
                    uVar15 = *(undefined8 *)(pBVar5 + 8);
                    *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                    *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                    lVar36 = lVar36 + 0x20;
                  } while (pBVar2 + 0x20 < pBVar25 + uVar24);
                }
                goto LAB_006a170f;
              }
              seqStore->lit = pBVar25 + uVar24;
              psVar39 = seqStore->sequences;
            }
            UVar26 = UVar37 - (uVar22 + uVar21);
            uVar31 = lVar32 - 3;
            psVar39->litLength = (U16)uVar24;
            psVar39->offset = UVar26 + 3;
            UVar40 = UVar42;
            goto joined_r0x006a17e3;
          }
          piVar29 = (int *)(pBVar10 + uVar35);
          if (*piVar29 == (int)*puVar27) {
            puVar34 = (ulong *)((long)puVar27 + 4);
            puVar33 = (ulong *)(piVar29 + 1);
            puVar19 = puVar34;
            if (puVar34 < (ulong *)((long)iEnd - 7U)) {
              if (*puVar33 == *puVar34) {
                lVar32 = 0;
                do {
                  puVar33 = (ulong *)((long)puVar27 + lVar32 + 0xc);
                  if ((ulong *)((long)iEnd - 7U) <= puVar33) {
                    puVar33 = (ulong *)(pBVar10 + lVar32 + uVar35 + 0xc);
                    puVar19 = (ulong *)((long)puVar27 + lVar32 + 0xc);
                    goto LAB_006a14da;
                  }
                  lVar36 = lVar32 + uVar35 + 0xc;
                  uVar24 = *puVar33;
                  lVar32 = lVar32 + 8;
                } while (*(ulong *)(pBVar10 + lVar36) == uVar24);
                uVar24 = uVar24 ^ *(ulong *)(pBVar10 + lVar36);
                uVar31 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                uVar24 = (uVar31 >> 3 & 0x1fffffff) + lVar32;
              }
              else {
                uVar31 = *puVar34 ^ *puVar33;
                uVar24 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                  }
                }
                uVar24 = uVar24 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_006a14da:
              if ((puVar19 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar33 == (int)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar19 < (ulong *)((long)iEnd + -1)) && ((short)*puVar33 == (short)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar19 < iEnd) {
                puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar19));
              }
              uVar24 = (long)puVar19 - (long)puVar34;
            }
            lVar32 = uVar24 + 4;
            if (src < puVar27) {
              pBVar25 = pBVar10 + (uVar35 - 1);
              do {
                puVar34 = (ulong *)((long)puVar23 + -1);
                if ((*(BYTE *)puVar34 != *pBVar25) ||
                   (lVar32 = lVar32 + 1, puVar23 = puVar34, pBVar25 <= iStart)) break;
                pBVar25 = pBVar25 + -1;
              } while (src < puVar34);
            }
            uVar24 = (long)puVar23 - (long)src;
            puVar34 = (ulong *)seqStore->lit;
            if (puVar1 < puVar23) {
              puVar19 = (ulong *)src;
              puVar33 = puVar34;
              if (src <= puVar1) {
                puVar33 = (ulong *)((long)puVar34 + ((long)puVar1 - (long)src));
                uVar31 = *(ulong *)((long)src + 8);
                *puVar34 = *src;
                puVar34[1] = uVar31;
                puVar19 = puVar1;
                if (0x10 < (long)puVar1 - (long)src) {
                  lVar36 = 0x10;
                  do {
                    uVar15 = *(undefined8 *)((BYTE *)((long)src + lVar36) + 8);
                    puVar3 = (undefined8 *)((long)puVar34 + lVar36);
                    *puVar3 = *(undefined8 *)((long)src + lVar36);
                    puVar3[1] = uVar15;
                    pBVar25 = (BYTE *)((long)src + lVar36 + 0x10);
                    uVar15 = *(undefined8 *)(pBVar25 + 8);
                    puVar3[2] = *(undefined8 *)pBVar25;
                    puVar3[3] = uVar15;
                    lVar36 = lVar36 + 0x20;
                  } while (puVar3 + 4 < puVar33);
                }
              }
              if (puVar19 < puVar23) {
                lVar36 = 0;
                do {
                  *(BYTE *)((long)puVar33 + lVar36) = *(BYTE *)((long)puVar19 + lVar36);
                  lVar36 = lVar36 + 1;
                } while ((long)puVar23 - (long)puVar19 != lVar36);
              }
LAB_006a1798:
              seqStore->lit = seqStore->lit + uVar24;
              psVar39 = seqStore->sequences;
              if (0xffff < uVar24) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
              }
            }
            else {
              uVar31 = *(ulong *)((long)src + 8);
              *puVar34 = *src;
              puVar34[1] = uVar31;
              pBVar25 = seqStore->lit;
              if (0x10 < uVar24) {
                uVar31 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar25 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar25 + 0x18) = uVar31;
                if (0x20 < (long)uVar24) {
                  lVar36 = 0;
                  do {
                    pBVar5 = (BYTE *)((long)src + lVar36 + 0x20);
                    uVar15 = *(undefined8 *)(pBVar5 + 8);
                    pBVar2 = pBVar25 + lVar36 + 0x20;
                    *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                    *(undefined8 *)(pBVar2 + 8) = uVar15;
                    pBVar5 = (BYTE *)((long)src + lVar36 + 0x30);
                    uVar15 = *(undefined8 *)(pBVar5 + 8);
                    *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                    *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                    lVar36 = lVar36 + 0x20;
                  } while (pBVar2 + 0x20 < pBVar25 + uVar24);
                }
                goto LAB_006a1798;
              }
              seqStore->lit = pBVar25 + uVar24;
              psVar39 = seqStore->sequences;
            }
            UVar26 = (int)puVar27 - (int)piVar29;
            uVar31 = lVar32 - 3;
            psVar39->litLength = (U16)uVar24;
            psVar39->offset = UVar26 + 3;
            UVar40 = UVar42;
            goto joined_r0x006a17e3;
          }
LAB_006a1361:
          puVar27 = (ulong *)((long)puVar27 +
                             ((long)puVar27 - (long)src >> 8) + (ulong)(uVar8 + (uVar8 == 0)));
        }
        else {
          puVar23 = (ulong *)((long)puVar27 + 1);
          puVar34 = iEnd;
          if (uVar22 < uVar6) {
            puVar34 = mEnd;
          }
          sVar18 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar27 + 5),(BYTE *)(piVar29 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar34,iStart);
          uVar24 = (long)puVar23 - (long)src;
          puVar27 = (ulong *)seqStore->lit;
          if (puVar1 < puVar23) {
            puVar34 = puVar27;
            puVar33 = (ulong *)src;
            if (src <= puVar1) {
              puVar34 = (ulong *)((long)puVar27 + ((long)puVar1 - (long)src));
              uVar31 = *(ulong *)((long)src + 8);
              *puVar27 = *src;
              puVar27[1] = uVar31;
              puVar33 = puVar1;
              if (0x10 < (long)puVar1 - (long)src) {
                lVar32 = 0x10;
                do {
                  uVar15 = *(undefined8 *)((BYTE *)((long)src + lVar32) + 8);
                  puVar3 = (undefined8 *)((long)puVar27 + lVar32);
                  *puVar3 = *(undefined8 *)((long)src + lVar32);
                  puVar3[1] = uVar15;
                  pBVar25 = (BYTE *)((long)src + lVar32 + 0x10);
                  uVar15 = *(undefined8 *)(pBVar25 + 8);
                  puVar3[2] = *(undefined8 *)pBVar25;
                  puVar3[3] = uVar15;
                  lVar32 = lVar32 + 0x20;
                } while (puVar3 + 4 < puVar34);
              }
            }
            if (puVar33 < puVar23) {
              lVar32 = 0;
              do {
                *(BYTE *)((long)puVar34 + lVar32) = *(BYTE *)((long)puVar33 + lVar32);
                lVar32 = lVar32 + 1;
              } while ((long)puVar23 - (long)puVar33 != lVar32);
            }
LAB_006a1450:
            seqStore->lit = seqStore->lit + uVar24;
            psVar39 = seqStore->sequences;
            if (0xffff < uVar24) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar31 = *(ulong *)((long)src + 8);
            *puVar27 = *src;
            puVar27[1] = uVar31;
            pBVar25 = seqStore->lit;
            if (0x10 < uVar24) {
              uVar31 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar25 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar25 + 0x18) = uVar31;
              if (0x20 < (long)uVar24) {
                lVar32 = 0;
                do {
                  pBVar5 = (BYTE *)((long)src + lVar32 + 0x20);
                  uVar15 = *(undefined8 *)(pBVar5 + 8);
                  pBVar2 = pBVar25 + lVar32 + 0x20;
                  *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                  *(undefined8 *)(pBVar2 + 8) = uVar15;
                  pBVar5 = (BYTE *)((long)src + lVar32 + 0x30);
                  uVar15 = *(undefined8 *)(pBVar5 + 8);
                  *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                  *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                  lVar32 = lVar32 + 0x20;
                } while (pBVar2 + 0x20 < pBVar25 + uVar24);
              }
              goto LAB_006a1450;
            }
            seqStore->lit = pBVar25 + uVar24;
            psVar39 = seqStore->sequences;
          }
          lVar32 = sVar18 + 4;
          uVar31 = sVar18 + 1;
          psVar39->litLength = (U16)uVar24;
          psVar39->offset = 1;
          UVar26 = UVar42;
joined_r0x006a17e3:
          if (0xffff < uVar31) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
          }
          puVar27 = (ulong *)(lVar32 + (long)puVar23);
          psVar39->matchLength = (U16)uVar31;
          psVar39 = psVar39 + 1;
          seqStore->sequences = psVar39;
          src = puVar27;
          UVar42 = UVar26;
          if (puVar27 <= puVar4) {
            pUVar13[(ulong)(*(long *)(pBVar10 + (uVar38 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                    (bVar20 & 0x3f)] = UVar37 + 2;
            pUVar13[(ulong)(*(long *)((long)puVar27 + -2) * -0x30e44323405a9d00) >> (bVar20 & 0x3f)]
                 = ((int)puVar27 + -2) - iVar28;
            UVar37 = UVar40;
            do {
              UVar16 = UVar26;
              UVar26 = (int)puVar27 - iVar28;
              uVar22 = UVar26 - UVar37;
              pBVar25 = pBVar10;
              if (uVar22 < uVar6) {
                pBVar25 = pBVar12 + -(ulong)uVar21;
              }
              src = puVar27;
              UVar42 = UVar16;
              UVar40 = UVar37;
              if (((uVar6 - 1) - uVar22 < 3) || (*(int *)(pBVar25 + uVar22) != (int)*puVar27))
              break;
              puVar23 = iEnd;
              if (uVar22 < uVar6) {
                puVar23 = mEnd;
              }
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar25 + uVar22) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar23,iStart);
              if (puVar27 <= puVar1) {
                puVar23 = (ulong *)seqStore->lit;
                uVar24 = puVar27[1];
                *puVar23 = *puVar27;
                puVar23[1] = uVar24;
                psVar39 = seqStore->sequences;
              }
              psVar39->litLength = 0;
              psVar39->offset = 1;
              if (0xffff < sVar18 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar39->matchLength = (U16)(sVar18 + 1);
              psVar39 = psVar39 + 1;
              seqStore->sequences = psVar39;
              pUVar13[*puVar27 * -0x30e44323405a9d00 >> (bVar20 & 0x3f)] = UVar26;
              puVar27 = (ulong *)((long)puVar27 + sVar18 + 4);
              src = puVar27;
              UVar42 = UVar37;
              UVar40 = UVar16;
              UVar26 = UVar37;
              UVar37 = UVar16;
            } while (puVar27 <= puVar4);
          }
        }
      } while (puVar27 < puVar4);
    }
  }
  else if (puVar27 < puVar4) {
    uVar8 = (ms->cParams).targetLength;
    bVar20 = 0x20 - (char)(ms->cParams).hashLog;
    uVar9 = (pZVar11->cParams).hashLog;
    puVar1 = iEnd + -4;
    do {
      uVar30 = (uint)((int)*puVar27 * -0x61c8864f) >> (bVar20 & 0x1f);
      uVar31 = (long)puVar27 - (long)pBVar10;
      uVar22 = pUVar13[uVar30];
      uVar24 = (ulong)uVar22;
      UVar37 = (U32)uVar31;
      uVar17 = (UVar37 - UVar42) + 1;
      piVar29 = (int *)(pBVar10 + uVar17);
      if (uVar17 < uVar6) {
        piVar29 = (int *)(pBVar12 + (uVar17 - uVar21));
      }
      pUVar13[uVar30] = UVar37;
      if (((uVar6 - 1) - uVar17 < 3) || (*piVar29 != *(int *)((long)puVar27 + 1))) {
        puVar23 = puVar27;
        if (uVar22 <= uVar6) {
          uVar22 = pUVar14[(uint)((int)*puVar27 * -0x61c8864f) >> (0x20U - (char)uVar9 & 0x1f)];
          if ((uVar22 <= uVar7) || (*(int *)(pBVar12 + uVar22) != (int)*puVar27)) goto LAB_006a2e7a;
          sVar18 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar12 + uVar22) + 4),
                              (BYTE *)iEnd,(BYTE *)mEnd,iStart);
          lVar32 = sVar18 + 4;
          if (src < puVar27) {
            pBVar25 = pBVar12 + ((ulong)uVar22 - 1);
            do {
              puVar34 = (ulong *)((long)puVar27 + -1);
              puVar23 = puVar27;
              if ((*(BYTE *)puVar34 != *pBVar25) ||
                 (lVar32 = lVar32 + 1, puVar23 = puVar34, pBVar25 <= pBVar41)) break;
              pBVar25 = pBVar25 + -1;
              puVar27 = puVar34;
            } while (src < puVar34);
          }
          uVar24 = (long)puVar23 - (long)src;
          puVar27 = (ulong *)seqStore->lit;
          if (puVar1 < puVar23) {
            puVar34 = puVar27;
            puVar33 = (ulong *)src;
            if (src <= puVar1) {
              puVar34 = (ulong *)((long)puVar27 + ((long)puVar1 - (long)src));
              uVar38 = *(ulong *)((long)src + 8);
              *puVar27 = *src;
              puVar27[1] = uVar38;
              puVar33 = puVar1;
              if (0x10 < (long)puVar1 - (long)src) {
                lVar36 = 0x10;
                do {
                  uVar15 = *(undefined8 *)((BYTE *)((long)src + lVar36) + 8);
                  puVar3 = (undefined8 *)((long)puVar27 + lVar36);
                  *puVar3 = *(undefined8 *)((long)src + lVar36);
                  puVar3[1] = uVar15;
                  pBVar25 = (BYTE *)((long)src + lVar36 + 0x10);
                  uVar15 = *(undefined8 *)(pBVar25 + 8);
                  puVar3[2] = *(undefined8 *)pBVar25;
                  puVar3[3] = uVar15;
                  lVar36 = lVar36 + 0x20;
                } while (puVar3 + 4 < puVar34);
              }
            }
            if (puVar33 < puVar23) {
              lVar36 = 0;
              do {
                *(BYTE *)((long)puVar34 + lVar36) = *(BYTE *)((long)puVar33 + lVar36);
                lVar36 = lVar36 + 1;
              } while ((long)puVar23 - (long)puVar33 != lVar36);
            }
LAB_006a3225:
            seqStore->lit = seqStore->lit + uVar24;
            psVar39 = seqStore->sequences;
            if (0xffff < uVar24) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar38 = *(ulong *)((long)src + 8);
            *puVar27 = *src;
            puVar27[1] = uVar38;
            pBVar25 = seqStore->lit;
            if (0x10 < uVar24) {
              uVar38 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar25 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar25 + 0x18) = uVar38;
              if (0x20 < (long)uVar24) {
                lVar36 = 0;
                do {
                  pBVar5 = (BYTE *)((long)src + lVar36 + 0x20);
                  uVar15 = *(undefined8 *)(pBVar5 + 8);
                  pBVar2 = pBVar25 + lVar36 + 0x20;
                  *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                  *(undefined8 *)(pBVar2 + 8) = uVar15;
                  pBVar5 = (BYTE *)((long)src + lVar36 + 0x30);
                  uVar15 = *(undefined8 *)(pBVar5 + 8);
                  *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                  *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                  lVar36 = lVar36 + 0x20;
                } while (pBVar2 + 0x20 < pBVar25 + uVar24);
              }
              goto LAB_006a3225;
            }
            seqStore->lit = pBVar25 + uVar24;
            psVar39 = seqStore->sequences;
          }
          UVar26 = UVar37 - (uVar22 + uVar21);
          uVar38 = lVar32 - 3;
          psVar39->litLength = (U16)uVar24;
          psVar39->offset = UVar26 + 3;
          UVar40 = UVar42;
          goto joined_r0x006a32f9;
        }
        piVar29 = (int *)(pBVar10 + uVar24);
        if (*piVar29 == (int)*puVar27) {
          puVar34 = (ulong *)((long)puVar27 + 4);
          puVar33 = (ulong *)(piVar29 + 1);
          puVar19 = puVar34;
          if (puVar34 < (ulong *)((long)iEnd - 7U)) {
            if (*puVar33 == *puVar34) {
              lVar32 = 0;
              do {
                puVar33 = (ulong *)((long)puVar27 + lVar32 + 0xc);
                if ((ulong *)((long)iEnd - 7U) <= puVar33) {
                  puVar33 = (ulong *)(pBVar10 + lVar32 + uVar24 + 0xc);
                  puVar19 = (ulong *)((long)puVar27 + lVar32 + 0xc);
                  goto LAB_006a2ff0;
                }
                lVar36 = lVar32 + uVar24 + 0xc;
                uVar38 = *puVar33;
                lVar32 = lVar32 + 8;
              } while (*(ulong *)(pBVar10 + lVar36) == uVar38);
              uVar38 = uVar38 ^ *(ulong *)(pBVar10 + lVar36);
              uVar35 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              uVar38 = (uVar35 >> 3 & 0x1fffffff) + lVar32;
            }
            else {
              uVar35 = *puVar34 ^ *puVar33;
              uVar38 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                }
              }
              uVar38 = uVar38 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_006a2ff0:
            if ((puVar19 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar33 == (int)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar33 = (ulong *)((long)puVar33 + 4);
            }
            if ((puVar19 < (ulong *)((long)iEnd + -1)) && ((short)*puVar33 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar33 = (ulong *)((long)puVar33 + 2);
            }
            if (puVar19 < iEnd) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar19));
            }
            uVar38 = (long)puVar19 - (long)puVar34;
          }
          lVar32 = uVar38 + 4;
          if (src < puVar27) {
            pBVar25 = pBVar10 + (uVar24 - 1);
            do {
              puVar34 = (ulong *)((long)puVar23 + -1);
              if ((*(BYTE *)puVar34 != *pBVar25) ||
                 (lVar32 = lVar32 + 1, puVar23 = puVar34, pBVar25 <= iStart)) break;
              pBVar25 = pBVar25 + -1;
            } while (src < puVar34);
          }
          uVar24 = (long)puVar23 - (long)src;
          puVar34 = (ulong *)seqStore->lit;
          if (puVar1 < puVar23) {
            puVar19 = (ulong *)src;
            puVar33 = puVar34;
            if (src <= puVar1) {
              puVar33 = (ulong *)((long)puVar34 + ((long)puVar1 - (long)src));
              uVar38 = *(ulong *)((long)src + 8);
              *puVar34 = *src;
              puVar34[1] = uVar38;
              puVar19 = puVar1;
              if (0x10 < (long)puVar1 - (long)src) {
                lVar36 = 0x10;
                do {
                  uVar15 = *(undefined8 *)((BYTE *)((long)src + lVar36) + 8);
                  puVar3 = (undefined8 *)((long)puVar34 + lVar36);
                  *puVar3 = *(undefined8 *)((long)src + lVar36);
                  puVar3[1] = uVar15;
                  pBVar25 = (BYTE *)((long)src + lVar36 + 0x10);
                  uVar15 = *(undefined8 *)(pBVar25 + 8);
                  puVar3[2] = *(undefined8 *)pBVar25;
                  puVar3[3] = uVar15;
                  lVar36 = lVar36 + 0x20;
                } while (puVar3 + 4 < puVar33);
              }
            }
            if (puVar19 < puVar23) {
              lVar36 = 0;
              do {
                *(BYTE *)((long)puVar33 + lVar36) = *(BYTE *)((long)puVar19 + lVar36);
                lVar36 = lVar36 + 1;
              } while ((long)puVar23 - (long)puVar19 != lVar36);
            }
LAB_006a32ae:
            seqStore->lit = seqStore->lit + uVar24;
            psVar39 = seqStore->sequences;
            if (0xffff < uVar24) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar38 = *(ulong *)((long)src + 8);
            *puVar34 = *src;
            puVar34[1] = uVar38;
            pBVar25 = seqStore->lit;
            if (0x10 < uVar24) {
              uVar38 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar25 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar25 + 0x18) = uVar38;
              if (0x20 < (long)uVar24) {
                lVar36 = 0;
                do {
                  pBVar5 = (BYTE *)((long)src + lVar36 + 0x20);
                  uVar15 = *(undefined8 *)(pBVar5 + 8);
                  pBVar2 = pBVar25 + lVar36 + 0x20;
                  *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                  *(undefined8 *)(pBVar2 + 8) = uVar15;
                  pBVar5 = (BYTE *)((long)src + lVar36 + 0x30);
                  uVar15 = *(undefined8 *)(pBVar5 + 8);
                  *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                  *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                  lVar36 = lVar36 + 0x20;
                } while (pBVar2 + 0x20 < pBVar25 + uVar24);
              }
              goto LAB_006a32ae;
            }
            seqStore->lit = pBVar25 + uVar24;
            psVar39 = seqStore->sequences;
          }
          UVar26 = (int)puVar27 - (int)piVar29;
          uVar38 = lVar32 - 3;
          psVar39->litLength = (U16)uVar24;
          psVar39->offset = UVar26 + 3;
          UVar40 = UVar42;
          goto joined_r0x006a32f9;
        }
LAB_006a2e7a:
        puVar27 = (ulong *)((long)puVar27 +
                           ((long)puVar27 - (long)src >> 8) + (ulong)(uVar8 + (uVar8 == 0)));
      }
      else {
        puVar23 = (ulong *)((long)puVar27 + 1);
        puVar34 = iEnd;
        if (uVar17 < uVar6) {
          puVar34 = mEnd;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar27 + 5),(BYTE *)(piVar29 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar34,iStart);
        uVar24 = (long)puVar23 - (long)src;
        puVar27 = (ulong *)seqStore->lit;
        if (puVar1 < puVar23) {
          puVar34 = puVar27;
          puVar33 = (ulong *)src;
          if (src <= puVar1) {
            puVar34 = (ulong *)((long)puVar27 + ((long)puVar1 - (long)src));
            uVar38 = *(ulong *)((long)src + 8);
            *puVar27 = *src;
            puVar27[1] = uVar38;
            puVar33 = puVar1;
            if (0x10 < (long)puVar1 - (long)src) {
              lVar32 = 0x10;
              do {
                uVar15 = *(undefined8 *)((BYTE *)((long)src + lVar32) + 8);
                puVar3 = (undefined8 *)((long)puVar27 + lVar32);
                *puVar3 = *(undefined8 *)((long)src + lVar32);
                puVar3[1] = uVar15;
                pBVar25 = (BYTE *)((long)src + lVar32 + 0x10);
                uVar15 = *(undefined8 *)(pBVar25 + 8);
                puVar3[2] = *(undefined8 *)pBVar25;
                puVar3[3] = uVar15;
                lVar32 = lVar32 + 0x20;
              } while (puVar3 + 4 < puVar34);
            }
          }
          if (puVar33 < puVar23) {
            lVar32 = 0;
            do {
              *(BYTE *)((long)puVar34 + lVar32) = *(BYTE *)((long)puVar33 + lVar32);
              lVar32 = lVar32 + 1;
            } while ((long)puVar23 - (long)puVar33 != lVar32);
          }
LAB_006a2f66:
          seqStore->lit = seqStore->lit + uVar24;
          psVar39 = seqStore->sequences;
          if (0xffff < uVar24) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar38 = *(ulong *)((long)src + 8);
          *puVar27 = *src;
          puVar27[1] = uVar38;
          pBVar25 = seqStore->lit;
          if (0x10 < uVar24) {
            uVar38 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar25 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar25 + 0x18) = uVar38;
            if (0x20 < (long)uVar24) {
              lVar32 = 0;
              do {
                pBVar5 = (BYTE *)((long)src + lVar32 + 0x20);
                uVar15 = *(undefined8 *)(pBVar5 + 8);
                pBVar2 = pBVar25 + lVar32 + 0x20;
                *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                *(undefined8 *)(pBVar2 + 8) = uVar15;
                pBVar5 = (BYTE *)((long)src + lVar32 + 0x30);
                uVar15 = *(undefined8 *)(pBVar5 + 8);
                *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                *(undefined8 *)(pBVar2 + 0x18) = uVar15;
                lVar32 = lVar32 + 0x20;
              } while (pBVar2 + 0x20 < pBVar25 + uVar24);
            }
            goto LAB_006a2f66;
          }
          seqStore->lit = pBVar25 + uVar24;
          psVar39 = seqStore->sequences;
        }
        lVar32 = sVar18 + 4;
        uVar38 = sVar18 + 1;
        psVar39->litLength = (U16)uVar24;
        psVar39->offset = 1;
        UVar26 = UVar42;
joined_r0x006a32f9:
        if (0xffff < uVar38) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
        }
        puVar27 = (ulong *)(lVar32 + (long)puVar23);
        psVar39->matchLength = (U16)uVar38;
        psVar39 = psVar39 + 1;
        seqStore->sequences = psVar39;
        src = puVar27;
        UVar42 = UVar26;
        if (puVar27 <= puVar4) {
          pUVar13[(uint)(*(int *)(pBVar10 + (uVar31 & 0xffffffff) + 2) * -0x61c8864f) >>
                  (bVar20 & 0x1f)] = UVar37 + 2;
          pUVar13[(uint)(*(int *)((long)puVar27 + -2) * -0x61c8864f) >> (bVar20 & 0x1f)] =
               ((int)puVar27 + -2) - iVar28;
          UVar37 = UVar40;
          do {
            UVar16 = UVar26;
            UVar26 = (int)puVar27 - iVar28;
            uVar22 = UVar26 - UVar37;
            pBVar25 = pBVar10;
            if (uVar22 < uVar6) {
              pBVar25 = pBVar12 + -(ulong)uVar21;
            }
            src = puVar27;
            UVar42 = UVar16;
            UVar40 = UVar37;
            if (((uVar6 - 1) - uVar22 < 3) || (*(int *)(pBVar25 + uVar22) != (int)*puVar27)) break;
            puVar23 = iEnd;
            if (uVar22 < uVar6) {
              puVar23 = mEnd;
            }
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar25 + uVar22) + 4),
                                (BYTE *)iEnd,(BYTE *)puVar23,iStart);
            if (puVar27 <= puVar1) {
              puVar23 = (ulong *)seqStore->lit;
              uVar24 = puVar27[1];
              *puVar23 = *puVar27;
              puVar23[1] = uVar24;
              psVar39 = seqStore->sequences;
            }
            psVar39->litLength = 0;
            psVar39->offset = 1;
            if (0xffff < sVar18 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar39->matchLength = (U16)(sVar18 + 1);
            psVar39 = psVar39 + 1;
            seqStore->sequences = psVar39;
            pUVar13[(uint)((int)*puVar27 * -0x61c8864f) >> (bVar20 & 0x1f)] = UVar26;
            puVar27 = (ulong *)((long)puVar27 + sVar18 + 4);
            src = puVar27;
            UVar42 = UVar37;
            UVar40 = UVar16;
            UVar26 = UVar37;
            UVar37 = UVar16;
          } while (puVar27 <= puVar4);
        }
      }
    } while (puVar27 < puVar4);
  }
  *rep = UVar42;
  rep[1] = UVar40;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}